

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

int open_log(void)

{
  byte bVar1;
  tm *__tp;
  time_t now;
  time_t local_10;
  
  time(&local_10);
  __tp = localtime(&local_10);
  strftime(file_name,0x32,"%d_%m_%Y_%H_%M.csv",__tp);
  std::ofstream::open((char *)&log_file,0x106530);
  bVar1 = std::__basic_file<char>::is_open();
  return bVar1 - 1;
}

Assistant:

int open_log()
{
    time_t now;
    time(&now);

    tm *local_now;
    local_now = localtime(&now);

    strftime(file_name, 50, "%d_%m_%Y_%H_%M.csv", local_now);

    log_file.open(file_name, ios_base::out);

    return (log_file.is_open() ? 0 : -1);
}